

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  PointerReader reader;
  Reader reader_00;
  Builder builder_00;
  Reader reader_01;
  Builder reader_02;
  Reader reader_03;
  PointerReader reader_04;
  PointerBuilder builder_01;
  PointerBuilder builder_02;
  Builder builder_03;
  Builder builder_04;
  undefined8 uVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  ListElementCount LVar4;
  ulong uVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ListSchema LVar9;
  Orphanage OVar10;
  Own<capnp::ClientHook> OVar11;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  BuilderFor<capnp::DynamicList> list;
  Builder root;
  MallocMessageBuilder builder;
  anon_union_8_2_eba6ea51_for_Type_5 local_408;
  Type TStack_400;
  int in_stack_fffffffffffffc10;
  int iVar12;
  uint in_stack_fffffffffffffc14;
  uint uVar13;
  undefined4 in_stack_fffffffffffffc18;
  short in_stack_fffffffffffffc1c;
  undefined2 in_stack_fffffffffffffc1e;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  undefined8 in_stack_fffffffffffffc28;
  WirePointer *in_stack_fffffffffffffc30;
  anon_union_8_2_eba6ea51_for_Type_5 local_3b8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_3b0;
  anon_union_8_2_eba6ea51_for_Type_5 local_3a8;
  OrphanBuilder OStack_3a0;
  undefined8 in_stack_fffffffffffffc80;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc88;
  anon_union_8_2_eba6ea51_for_Type_5 aVar14;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc90;
  SegmentBuilder *pSStack_360;
  Schema local_348;
  undefined8 uStack_340;
  WirePointer *local_338;
  BitsPerElementN<23> in_stack_fffffffffffffcd4;
  WirePointer *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  uint in_stack_fffffffffffffcf0;
  uint uVar15;
  undefined4 in_stack_fffffffffffffcf4;
  SegmentBuilder *pSStack_308;
  anon_union_8_2_eba6ea51_for_Type_5 local_2e8;
  anon_union_8_2_eba6ea51_for_Type_5 local_2e0;
  SegmentBuilder *pSStack_2d8;
  StructBuilder local_2c8;
  StructBuilder local_2a0;
  StructBuilder local_278;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  StructReader local_1b0;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> local_180 [48];
  Type local_150;
  SegmentReader *in_stack_fffffffffffffec0;
  CapTableReader *in_stack_fffffffffffffec8;
  byte *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  MallocMessageBuilder local_110;
  size_type sVar2;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_3b8,&local_110.super_MessageBuilder);
  local_408 = local_3b8;
  aVar14 = in_stack_fffffffffffffc88;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffc88,(PointerBuilder *)&local_408,
             (StructSize)0x10000,(word *)0x0);
  local_408 = aVar14;
  aVar14 = local_408;
  TStack_400._0_8_ = in_stack_fffffffffffffc90;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            (local_180,(EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffec8;
  builder_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffec0;
  builder_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffed0;
  builder_04.builder.data = (void *)in_stack_fffffffffffffed8;
  builder_04.builder.pointers = (WirePointer *)in_stack_fffffffffffffee0;
  builder_04.builder.dataSize = (int)in_stack_fffffffffffffee8;
  builder_04.builder.pointerCount = SUB82(in_stack_fffffffffffffee8,4);
  builder_04.builder._38_2_ = SUB82(in_stack_fffffffffffffee8,6);
  initDynamicTestMessage(builder_04);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc88);
  bVar6 = in_stack_fffffffffffffc1c == 0;
  local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)
              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
  if (bVar6) {
    local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)0;
  }
  OStack_3a0.tag.content._0_4_ = 0x7fffffff;
  if (!bVar6) {
    OStack_3a0.tag.content._0_4_ = in_stack_fffffffffffffc20;
  }
  local_3b8.scopeId._0_4_ = 0;
  local_3b8.scopeId._4_4_ = 0;
  aStack_3b0.scopeId._0_4_ = 0;
  aStack_3b0.scopeId._4_4_ = 0;
  if (!bVar6) {
    local_3b8.scopeId._0_4_ = local_408.scopeId._0_4_;
    local_3b8.scopeId._4_4_ = local_408.scopeId._4_4_;
    aStack_3b0.scopeId._0_4_ = TStack_400._0_4_;
    aStack_3b0.scopeId._4_4_ = TStack_400._4_4_;
  }
  PointerReader::getStruct(&local_1b0,(PointerReader *)&local_3b8,(word *)0x0);
  reader_00._reader.capTable = local_1b0.capTable;
  reader_00._reader.segment = local_1b0.segment;
  reader_00._reader.data = local_1b0.data;
  reader_00._reader.pointers = local_1b0.pointers;
  reader_00._reader.dataSize = local_1b0.dataSize;
  reader_00._reader.pointerCount = local_1b0.pointerCount;
  reader_00._reader._38_2_ = local_1b0._38_2_;
  reader_00._reader.nestingLimit = local_1b0.nestingLimit;
  reader_00._reader._44_4_ = local_1b0._44_4_;
  checkTestMessage(reader_00);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc88);
  bVar6 = in_stack_fffffffffffffc1c != 0;
  local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)0;
  if (bVar6) {
    local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)
                CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
  }
  OStack_3a0.tag.content._0_4_ = 0x7fffffff;
  if (bVar6) {
    OStack_3a0.tag.content._0_4_ = in_stack_fffffffffffffc20;
  }
  local_3b8.scopeId._0_4_ = 0;
  local_3b8.scopeId._4_4_ = 0;
  aStack_3b0.scopeId._0_4_ = 0;
  aStack_3b0.scopeId._4_4_ = 0;
  if (bVar6) {
    local_3b8.scopeId._0_4_ = local_408.scopeId._0_4_;
    local_3b8.scopeId._4_4_ = local_408.scopeId._4_4_;
    aStack_3b0.scopeId._0_4_ = TStack_400._0_4_;
    aStack_3b0.scopeId._4_4_ = TStack_400._4_4_;
  }
  reader_04.segment._4_4_ = in_stack_fffffffffffffc14;
  reader_04.segment._0_4_ = in_stack_fffffffffffffc10;
  reader_04.capTable._0_4_ = in_stack_fffffffffffffc18;
  reader_04.capTable._4_2_ = in_stack_fffffffffffffc1c;
  reader_04.capTable._6_2_ = in_stack_fffffffffffffc1e;
  reader_04.pointer._0_4_ = in_stack_fffffffffffffc20;
  reader_04.pointer._4_4_ = in_stack_fffffffffffffc24;
  reader_04._24_8_ = in_stack_fffffffffffffc28;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_04,(StructSchema)aStack_3b0);
  reader_01.reader.segment = (SegmentReader *)uStack_210;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_218;
  reader_01.reader.capTable = (CapTableReader *)local_208;
  reader_01.reader.data = (void *)uStack_200;
  reader_01.reader.pointers = (WirePointer *)local_1f8;
  reader_01.reader.dataSize = (undefined4)uStack_1f0;
  reader_01.reader.pointerCount = uStack_1f0._4_2_;
  reader_01.reader._38_2_ = uStack_1f0._6_2_;
  reader_01.reader._40_8_ = local_1e8;
  checkDynamicTestMessage(reader_01);
  builder_01.segment._4_4_ = in_stack_fffffffffffffc24;
  builder_01.segment._0_4_ = in_stack_fffffffffffffc20;
  builder_01.capTable = (CapTableBuilder *)in_stack_fffffffffffffc28;
  builder_01.pointer = in_stack_fffffffffffffc30;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(builder_01,(StructSchema)aVar14);
  builder_00.builder.segment = (SegmentBuilder *)uStack_1d8;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1e0;
  builder_00.builder.capTable = (CapTableBuilder *)local_1d0;
  builder_00.builder.data = (void *)uStack_1c8;
  builder_00.builder.pointers = (WirePointer *)local_1c0;
  builder_00.builder.dataSize = (undefined4)uStack_1b8;
  builder_00.builder.pointerCount = uStack_1b8._4_2_;
  builder_00.builder._38_2_ = uStack_1b8._6_2_;
  local_408 = aVar14;
  checkDynamicTestMessage(builder_00);
  TStack_400.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_360;
  aVar14 = local_408;
  ListSchema::of(UINT32);
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&local_3b8);
  local_408.scopeId._0_4_ = 3;
  TStack_400.baseType = 0x7b;
  TStack_400.listDepth = '\0';
  TStack_400.isImplicitParam = false;
  TStack_400.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_400._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3b8,0,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_408.scopeId._0_4_ = 3;
  TStack_400.baseType = 0x1c8;
  TStack_400.listDepth = '\0';
  TStack_400.isImplicitParam = false;
  TStack_400.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_400._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3b8,1,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_408.scopeId._0_4_ = 3;
  TStack_400.baseType = 0x315;
  TStack_400.listDepth = '\0';
  TStack_400.isImplicitParam = false;
  TStack_400.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_400._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3b8,2,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_408.scopeId._0_4_ = 3;
  TStack_400.baseType = 0xcd15;
  TStack_400.listDepth = '[';
  TStack_400.isImplicitParam = true;
  TStack_400.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_400._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_3b8,3,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc88);
  bVar6 = OStack_3a0.segment._4_2_ == 0;
  local_338 = (WirePointer *)OStack_3a0.tag.content;
  if (bVar6) {
    local_338 = (WirePointer *)0x0;
  }
  LVar4 = 0x7fffffff;
  if (!bVar6) {
    LVar4 = (ListElementCount)OStack_3a0.capTable;
  }
  local_348.raw._0_4_ = 0;
  local_348.raw._4_4_ = 0;
  uVar7 = 0;
  uVar8 = 0;
  if (!bVar6) {
    local_348.raw._0_4_ = local_3b8.scopeId._0_4_;
    local_348.raw._4_4_ = local_3b8.scopeId._4_4_;
    uVar7 = aStack_3b0.scopeId._0_4_;
    uVar8 = aStack_3b0.scopeId._4_4_;
  }
  uStack_340 = (SegmentBuilder *)CONCAT44(uVar8,uVar7);
  PointerReader::getList
            ((ListReader *)&local_408,(PointerReader *)&local_348,FOUR_BYTES,(word *)0x0);
  if (in_stack_fffffffffffffc10 != 4) {
    local_348.raw._0_4_ = 4;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_3b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","4u, list.size()",(uint *)&local_348,
               (uint *)&stack0xfffffffffffffcf0);
    kj::_::Debug::Fault::fatal((Fault *)&local_3b8);
  }
  if (kj::_::Debug::minSeverity < 3 && *(int *)TStack_400.field_4 != 0x7b) {
    local_3b8.scopeId._0_4_ = 0x7b;
    local_348.raw._0_4_ = *(undefined4 *)TStack_400.field_4;
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x96,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
               (char (*) [37])"failed: expected (123u) == (list[0])",(uint *)&local_3b8.scopeId,
               (uint *)&local_348);
  }
  aVar3 = TStack_400.field_4;
  if (kj::_::Debug::minSeverity < 3 &&
      *(int *)((long)TStack_400.field_4.schema + (ulong)(in_stack_fffffffffffffc14 >> 3)) != 0x1c8)
  {
    local_3b8.scopeId._0_4_ = 0x1c8;
    local_348.raw._0_4_ =
         *(int *)((long)TStack_400.field_4.schema + (ulong)(in_stack_fffffffffffffc14 >> 3));
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x97,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
               (char (*) [37])"failed: expected (456u) == (list[1])",(uint *)&local_3b8.scopeId,
               (uint *)&local_348);
    aVar3 = TStack_400.field_4;
  }
  if (kj::_::Debug::minSeverity < 3 &&
      *(int *)((long)aVar3.schema + (ulong)(in_stack_fffffffffffffc14 >> 2)) != 0x315) {
    local_3b8.scopeId._0_4_ = 0x315;
    local_348.raw._0_4_ = *(int *)((long)aVar3.schema + (ulong)(in_stack_fffffffffffffc14 >> 2));
    kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x98,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
               (char (*) [37])"failed: expected (789u) == (list[2])",(uint *)&local_3b8.scopeId,
               (uint *)&local_348);
    aVar3 = TStack_400.field_4;
  }
  uVar5 = (ulong)in_stack_fffffffffffffc14 * 3 >> 3;
  if ((*(int *)((long)aVar3.schema + uVar5) != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_3b8.scopeId._0_4_ = 0x75bcd15;
    local_348.raw._0_4_ = *(int *)((long)aVar3.schema + uVar5);
    kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
               (char (*) [43])"failed: expected (123456789u) == (list[3])",
               (uint *)&local_3b8.scopeId,(uint *)&local_348);
  }
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc88);
  bVar6 = in_stack_fffffffffffffc1c != 0;
  local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)0;
  if (bVar6) {
    local_3a8 = (anon_union_8_2_eba6ea51_for_Type_5)
                CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10);
  }
  uVar7 = 0x7fffffff;
  if (bVar6) {
    uVar7 = in_stack_fffffffffffffc20;
  }
  local_3b8.scopeId._0_4_ = 0;
  local_3b8.scopeId._4_4_ = 0;
  aStack_3b0.scopeId._0_4_ = 0;
  aStack_3b0.scopeId._4_4_ = 0;
  if (bVar6) {
    local_3b8.scopeId._0_4_ = local_408.scopeId._0_4_;
    local_3b8.scopeId._4_4_ = local_408.scopeId._4_4_;
    aStack_3b0.scopeId._0_4_ = TStack_400._0_4_;
    aStack_3b0.scopeId._4_4_ = TStack_400._4_4_;
  }
  OStack_3a0.tag.content._0_4_ = uVar7;
  LVar9 = ListSchema::of(UINT32);
  sVar2 = LVar9.elementType._0_8_;
  reader.capTable = (CapTableReader *)aStack_3b0.schema;
  reader.segment = (SegmentReader *)local_3b8.schema;
  reader.pointer = (WirePointer *)local_3a8;
  reader._24_8_ = OStack_3a0.tag.content;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic((Reader *)&local_150,reader,LVar9);
  local_348.raw = (RawBrandedSchema *)0x1c80000007b;
  uStack_340 = (SegmentBuilder *)0x75bcd1500000315;
  reader_03.schema.elementType.field_4.schema = local_150.field_4.schema;
  reader_03.schema.elementType.baseType = local_150.baseType;
  reader_03.schema.elementType.listDepth = local_150.listDepth;
  reader_03.schema.elementType.isImplicitParam = local_150.isImplicitParam;
  reader_03.schema.elementType.field_3 = local_150.field_3;
  reader_03.schema.elementType._6_2_ = local_150._6_2_;
  reader_03.reader.segment = in_stack_fffffffffffffec0;
  reader_03.reader.capTable = in_stack_fffffffffffffec8;
  reader_03.reader.ptr = in_stack_fffffffffffffed0;
  reader_03.reader.elementCount = (ListElementCount)in_stack_fffffffffffffed8;
  reader_03.reader.step = SUB84(in_stack_fffffffffffffed8,4);
  reader_03.reader.structDataSize = (StructDataBitCount)in_stack_fffffffffffffee0;
  reader_03.reader.structPointerCount = SUB82(in_stack_fffffffffffffee0,4);
  reader_03.reader.elementSize = SUB81(in_stack_fffffffffffffee0,6);
  reader_03.reader._39_1_ = SUB81(in_stack_fffffffffffffee0,7);
  reader_03.reader.nestingLimit = (int)in_stack_fffffffffffffee8;
  reader_03.reader._44_4_ = SUB84(in_stack_fffffffffffffee8,4);
  expected._M_len = sVar2;
  expected._M_array = (iterator)&local_348;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_03,expected);
  local_408 = aVar14;
  aVar14 = local_408;
  TStack_400._0_8_ = in_stack_fffffffffffffc90;
  LVar9 = ListSchema::of(UINT32);
  sVar2 = LVar9.elementType._0_8_;
  builder_02.capTable = (CapTableBuilder *)aVar14.schema;
  builder_02.segment = (SegmentBuilder *)in_stack_fffffffffffffc80;
  builder_02.pointer = (WirePointer *)in_stack_fffffffffffffc90.schema;
  LVar9.elementType.field_4.schema = (RawBrandedSchema *)TStack_400._0_8_;
  LVar9.elementType._0_8_ = local_408.schema;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(builder_02,LVar9);
  local_3b8.schema = (RawBrandedSchema *)0x1c80000007b;
  aStack_3b0.schema = (RawBrandedSchema *)0x75bcd1500000315;
  reader_02.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uStack_248;
  reader_02.schema.elementType.baseType = (undefined2)local_250;
  reader_02.schema.elementType.listDepth = local_250._2_1_;
  reader_02.schema.elementType.isImplicitParam = (bool)local_250._3_1_;
  reader_02.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_250._4_2_;
  reader_02.schema.elementType._6_2_ = local_250._6_2_;
  reader_02.builder.segment = (SegmentBuilder *)local_240;
  reader_02.builder.capTable = (CapTableBuilder *)uStack_238;
  reader_02.builder.ptr = (byte *)local_230;
  reader_02.builder.elementCount = (undefined4)uStack_228;
  reader_02.builder.step = uStack_228._4_4_;
  reader_02.builder.structDataSize = (undefined4)local_220;
  reader_02.builder.structPointerCount = local_220._4_2_;
  reader_02.builder.elementSize = local_220._6_1_;
  reader_02.builder._39_1_ = local_220._7_1_;
  expected_00._M_len = sVar2;
  expected_00._M_array = (iterator)&local_3b8;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader_02,expected_00);
  local_3a8 = in_stack_fffffffffffffc90;
  aStack_3b0 = aVar14;
  local_3b8.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_00613430;
  local_408.scopeId._0_4_ = 6;
  TStack_400._0_8_ = "foo";
  TStack_400.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)0x4;
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  aVar14 = aStack_3b0;
  aVar3 = local_3a8;
  DynamicStruct::Builder::set((Builder *)&local_3b8,name,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_408 = aVar14;
  TStack_400.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_360;
  aVar14 = local_408;
  TStack_400._0_8_ = aVar3;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_3b8,(PointerBuilder *)&local_408,(void *)0x0,0);
  if (((local_3a8.schema != (RawBrandedSchema *)0x4) ||
      (*(char *)((long)&(aStack_3b0.schema)->generic + 2) != 'o' ||
       *(short *)&(aStack_3b0.schema)->generic != 0x6f66)) && (kj::_::Debug::minSeverity < 3)) {
    TStack_400.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_360;
    local_408 = aVar14;
    TStack_400._0_8_ = aVar3;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_3b8,(PointerBuilder *)&local_408,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[70],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xa4,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", \"foo\", root.getAnyPointerField().getAs<Text>()"
               ,(char (*) [70])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
               (char (*) [4])0x4da3ec,(Builder *)&local_3b8);
  }
  OVar10 = MessageBuilder::getOrphanage(&local_110.super_MessageBuilder);
  OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_408,OVar10.arena,OVar10.capTable,(StructSize)0x140006);
  local_2e0 = (anon_union_8_2_eba6ea51_for_Type_5)TStack_400._0_8_;
  pSStack_2d8 = (SegmentBuilder *)TStack_400.field_4;
  local_2e8.schema = local_408.schema;
  OrphanBuilder::asStruct(&local_278,(OrphanBuilder *)&local_2e8,(StructSize)0x140006);
  builder_03._builder.segment._4_4_ = in_stack_fffffffffffffcd4;
  builder_03._builder.segment._0_4_ = LVar4;
  builder_03._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffcd8;
  builder_03._builder.data = (void *)in_stack_fffffffffffffce0;
  builder_03._builder.pointers = (WirePointer *)in_stack_fffffffffffffce8;
  builder_03._builder.dataSize = in_stack_fffffffffffffcf0;
  builder_03._builder._36_4_ = in_stack_fffffffffffffcf4;
  initTestMessage(builder_03);
  OStack_3a0.segment = pSStack_360;
  local_3b8.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_00613430;
  OrphanBuilder::asStructReader
            ((StructReader *)&local_348,(OrphanBuilder *)&local_2e8,(StructSize)0x140006);
  local_408.scopeId._0_4_ = 10;
  TStack_400._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  TStack_400.field_4.schema = local_348.raw;
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_3b8,name_00,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_408 = aVar14;
  aVar14 = local_408;
  PointerBuilder::getStruct
            (&local_2a0,(PointerBuilder *)&local_408,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)root._builder);
  local_348.raw = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_00613430;
  OrphanBuilder::asStruct
            ((StructBuilder *)&stack0xfffffffffffffcf0,(OrphanBuilder *)&local_2e8,
             (StructSize)0x140006);
  uVar13 = (uint)((ulong)pSStack_308 >> 0x20);
  local_408.scopeId._0_4_ = 10;
  TStack_400._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  Orphan<capnp::DynamicValue>::Orphan
            ((Orphan<capnp::DynamicValue> *)&local_3b8,(Builder *)&local_408,
             (OrphanBuilder *)&local_2e8);
  DynamicValue::Builder::~Builder((Builder *)&local_408);
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Builder::adopt
            ((Builder *)&local_348,name_01,(Orphan<capnp::DynamicValue> *)&local_3b8);
  if (OStack_3a0.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_3a0);
  }
  local_408 = aVar14;
  TStack_400.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_360;
  TStack_400._0_8_ = aVar3.schema;
  aVar14 = local_408;
  PointerBuilder::getStruct
            (&local_2c8,(PointerBuilder *)&local_408,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)root._builder);
  if (local_2e0.schema != (RawBrandedSchema *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_2e8);
  }
  OVar10 = MessageBuilder::getOrphanage(&local_110.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_408,OVar10.arena,OVar10.capTable,3,FOUR_BYTES);
  uVar1 = TStack_400._0_8_;
  uVar15 = (uint)local_408.scopeId;
  uVar7 = (undefined4)((ulong)local_408 >> 0x20);
  OrphanBuilder::asList
            ((ListBuilder *)&local_408,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)TStack_400.field_4 = 0xc;
  OrphanBuilder::asList
            ((ListBuilder *)&local_408,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)((long)TStack_400.field_4 + (ulong)(uVar13 >> 3)) = 0x22;
  OrphanBuilder::asList
            ((ListBuilder *)&local_408,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  *(undefined4 *)((long)TStack_400.field_4 + (ulong)(uVar13 >> 2)) = 0x38;
  local_3b8.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_00613430;
  OrphanBuilder::asListReader
            ((ListReader *)&local_348,(OrphanBuilder *)&stack0xfffffffffffffcf0,FOUR_BYTES);
  TStack_400 = (Type)ListSchema::of(UINT32);
  iVar12 = (int)local_348.raw;
  uVar13 = (uint)((ulong)local_348.raw >> 0x20);
  local_408.scopeId._0_4_ = 8;
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_3b8,name_02,(Reader *)&local_408);
  DynamicValue::Reader::~Reader((Reader *)&local_408);
  local_3b8 = aVar14;
  aVar14 = local_3b8;
  PointerBuilder::getList
            ((ListBuilder *)&local_408,(PointerBuilder *)&local_3b8,FOUR_BYTES,(word *)0x0);
  if (iVar12 == 3) {
    if (kj::_::Debug::minSeverity < 3 && *(int *)&(TStack_400.field_4.schema)->generic != 0xc) {
      local_3b8.scopeId._0_4_ = 0xc;
      local_348.raw._0_4_ = *(undefined4 *)&(TStack_400.field_4.schema)->generic;
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", 12, l[0]",
                 (char (*) [32])"failed: expected (12) == (l[0])",(int *)&local_3b8.scopeId,
                 (uint *)&local_348);
    }
    aVar3 = TStack_400.field_4;
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)((long)&(TStack_400.field_4.schema)->generic + (ulong)(uVar13 >> 3)) != 0x22) {
      local_3b8.scopeId._0_4_ = 0x22;
      local_348.raw._0_4_ =
           *(undefined4 *)((long)&(TStack_400.field_4.schema)->generic + (ulong)(uVar13 >> 3));
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", 34, l[1]",
                 (char (*) [32])"failed: expected (34) == (l[1])",(int *)&local_3b8.scopeId,
                 (uint *)&local_348);
      aVar3.scopeId = TStack_400.field_4.scopeId;
    }
    if ((*(int *)((long)&(aVar3.schema)->generic + (ulong)(uVar13 >> 2)) != 0x38) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_3b8.scopeId._0_4_ = 0x38;
      local_348.raw._0_4_ = *(undefined4 *)((long)&(aVar3.schema)->generic + (ulong)(uVar13 >> 2));
      kj::_::Debug::log<char_const(&)[32],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", 56, l[2]",
                 (char (*) [32])"failed: expected (56) == (l[2])",(int *)&local_3b8.scopeId,
                 (uint *)&local_348);
    }
    aStack_3b0 = aVar14;
    if ((long *)uVar1 != (long *)0x0) {
      OrphanBuilder::euthanize((OrphanBuilder *)&stack0xfffffffffffffcf0);
      aStack_3b0 = aVar14;
    }
    local_3b8.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_00613430;
    Capability::Client::Client((Client *)&stack0xfffffffffffffcf0,(void *)0x0);
    (**(code **)(*(long *)uVar1 + 0x20))(&local_348);
    local_408.scopeId._0_4_ = 0xb;
    TStack_400._0_8_ = local_348.raw;
    name_03.content.size_ = 0x10;
    name_03.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&local_3b8,name_03,(Reader *)&local_408);
    DynamicValue::Reader::~Reader((Reader *)&local_408);
    if ((long *)uVar1 != (long *)0x0) {
      (*(code *)**(undefined8 **)CONCAT44(uVar7,uVar15))
                ((undefined8 *)CONCAT44(uVar7,uVar15),uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    }
    OVar11 = PointerBuilder::getCapability((PointerBuilder *)&local_3b8);
    if (aStack_3b0.schema != (RawBrandedSchema *)0x0) {
      (*(code *)(local_3b8.schema)->generic->id)
                (local_3b8.schema,
                 (long)&(aStack_3b0.schema)->generic +
                 *(long *)&(aStack_3b0.schema)->generic[-1].defaultBrand.scopeCount,OVar11.ptr);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_110);
    return;
  }
  local_348.raw._0_4_ = 3;
  local_2e8.scopeId._0_4_ = iVar12;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
            ((Fault *)&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0xb7,FAILED,"(3) == (l.size())","3, l.size()",(int *)&local_348,
             (uint *)&local_2e8.scopeId);
  kj::_::Debug::Fault::fatal((Fault *)&local_3b8);
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}